

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QColorDialogPrivate::addCustom(QColorDialogPrivate *this)

{
  int iVar1;
  int iVar2;
  
  QColorDialogOptions::setCustomColor(this->nextCust,this->cs->curCol);
  if (this->custom != (QWellArray *)0x0) {
    QWidget::update(&this->custom->super_QWidget);
  }
  iVar1 = this->nextCust;
  iVar2 = QColorDialogOptions::customColorCount();
  this->nextCust = (iVar1 + 1) % iVar2;
  return;
}

Assistant:

void QColorDialogPrivate::addCustom()
{
    QColorDialogOptions::setCustomColor(nextCust, cs->currentColor());
    if (custom)
        custom->update();
    nextCust = (nextCust+1) % QColorDialogOptions::customColorCount();
}